

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::Regexp::FactorAlternationRecursive(Regexp **sub,int n,ParseFlags altflags,int maxdepth)

{
  iterator pRVar1;
  int iVar2;
  RegexpOp RVar3;
  int iVar4;
  Rune lo;
  Rune hi;
  ParseFlags parse_flags;
  Regexp *pRVar5;
  Regexp **ppRVar6;
  iterator pRVar7;
  ostream *poVar8;
  CharClass *cc_00;
  bool bVar9;
  int local_2cc;
  undefined1 local_2c8 [4];
  int i_3;
  LogMessage local_2a8;
  iterator local_128;
  iterator it;
  CharClass *cc;
  Regexp *local_108;
  Regexp *re;
  undefined1 local_f8 [4];
  int j_2;
  CharClassBuilder ccb;
  int i_2;
  int nn_1;
  int j_1;
  Regexp *x_1 [2];
  Regexp *first_i;
  Regexp *pRStack_88;
  int i_1;
  Regexp *first;
  int nn;
  int j;
  Regexp *x [2];
  int local_5c;
  ParseFlags local_58;
  int same;
  ParseFlags runeflags_i;
  int nrune_i;
  Rune *rune_i;
  int local_40;
  int i;
  int out;
  int start;
  ParseFlags runeflags;
  int nrune;
  Rune *rune;
  ParseFlags local_20;
  int maxdepth_local;
  ParseFlags altflags_local;
  int n_local;
  Regexp **sub_local;
  
  sub_local._4_4_ = n;
  if (0 < maxdepth) {
    _runeflags = (Rune *)0x0;
    start = 0;
    out = 0;
    i = 0;
    local_40 = 0;
    rune._4_4_ = maxdepth;
    local_20 = altflags;
    maxdepth_local = n;
    _altflags_local = sub;
    for (rune_i._4_4_ = 0; rune_i._4_4_ <= maxdepth_local; rune_i._4_4_ = rune_i._4_4_ + 1) {
      _runeflags_i = (Rune *)0x0;
      same = 0;
      local_58 = NoParseFlags;
      if ((rune_i._4_4_ < maxdepth_local) &&
         (_runeflags_i = LeadingString(_altflags_local[rune_i._4_4_],&same,&local_58),
         local_58 == out)) {
        local_5c = 0;
        while( true ) {
          bVar9 = false;
          if ((local_5c < start) && (bVar9 = false, local_5c < same)) {
            bVar9 = _runeflags[local_5c] == _runeflags_i[local_5c];
          }
          if (!bVar9) break;
          local_5c = local_5c + 1;
        }
        if (local_5c < 1) goto LAB_0012f0b9;
        start = local_5c;
      }
      else {
LAB_0012f0b9:
        if (rune_i._4_4_ != i) {
          if (rune_i._4_4_ == i + 1) {
            _altflags_local[local_40] = _altflags_local[i];
          }
          else {
            _nn = LiteralString(_runeflags,start,out);
            for (first._4_4_ = i; first._4_4_ < rune_i._4_4_; first._4_4_ = first._4_4_ + 1) {
              RemoveLeadingString(_altflags_local[first._4_4_],start);
            }
            iVar2 = FactorAlternationRecursive
                              (_altflags_local + i,rune_i._4_4_ - i,local_20,rune._4_4_ + -1);
            x[0] = AlternateNoFactor(_altflags_local + i,iVar2,local_20);
            pRVar5 = Concat((Regexp **)&nn,2,local_20);
            _altflags_local[local_40] = pRVar5;
          }
          local_40 = local_40 + 1;
        }
        if (rune_i._4_4_ < maxdepth_local) {
          i = rune_i._4_4_;
          _runeflags = _runeflags_i;
          start = same;
          out = local_58;
        }
      }
    }
    maxdepth_local = local_40;
    i = 0;
    local_40 = 0;
    pRStack_88 = (Regexp *)0x0;
    for (first_i._4_4_ = 0; first_i._4_4_ <= maxdepth_local; first_i._4_4_ = first_i._4_4_ + 1) {
      x_1[1] = (Regexp *)0x0;
      if (((first_i._4_4_ < maxdepth_local) &&
          (x_1[1] = LeadingRegexp(_altflags_local[first_i._4_4_]), pRStack_88 != (Regexp *)0x0)) &&
         (bVar9 = Equal(pRStack_88,x_1[1]), bVar9)) {
        RVar3 = op(pRStack_88);
        if (((((RVar3 != kRegexpBeginLine) && (RVar3 = op(pRStack_88), RVar3 != kRegexpEndLine)) &&
             ((RVar3 = op(pRStack_88), RVar3 != kRegexpWordBoundary &&
              ((RVar3 = op(pRStack_88), RVar3 != kRegexpNoWordBoundary &&
               (RVar3 = op(pRStack_88), RVar3 != kRegexpBeginText)))))) &&
            (RVar3 = op(pRStack_88), RVar3 != kRegexpEndText)) &&
           (((RVar3 = op(pRStack_88), RVar3 != kRegexpCharClass &&
             (RVar3 = op(pRStack_88), RVar3 != kRegexpAnyChar)) &&
            (RVar3 = op(pRStack_88), RVar3 != kRegexpAnyByte)))) {
          RVar3 = op(pRStack_88);
          if (RVar3 == kRegexpRepeat) {
            iVar2 = min(pRStack_88);
            iVar4 = max(pRStack_88);
            if (iVar2 == iVar4) {
              ppRVar6 = Regexp::sub(pRStack_88);
              RVar3 = op(*ppRVar6);
              if (RVar3 != kRegexpLiteral) {
                ppRVar6 = Regexp::sub(pRStack_88);
                RVar3 = op(*ppRVar6);
                if (RVar3 != kRegexpCharClass) {
                  ppRVar6 = Regexp::sub(pRStack_88);
                  RVar3 = op(*ppRVar6);
                  if (RVar3 != kRegexpAnyChar) {
                    ppRVar6 = Regexp::sub(pRStack_88);
                    RVar3 = op(*ppRVar6);
                    if (RVar3 != kRegexpAnyByte) goto LAB_0012f3a1;
                  }
                }
              }
              goto LAB_0012f4e6;
            }
          }
          goto LAB_0012f3a1;
        }
      }
      else {
LAB_0012f3a1:
        if (first_i._4_4_ != i) {
          if (first_i._4_4_ == i + 1) {
            _altflags_local[local_40] = _altflags_local[i];
          }
          else {
            _nn_1 = Incref(pRStack_88);
            for (i_2 = i; i_2 < first_i._4_4_; i_2 = i_2 + 1) {
              pRVar5 = RemoveLeadingRegexp(_altflags_local[i_2]);
              _altflags_local[i_2] = pRVar5;
            }
            iVar2 = FactorAlternationRecursive
                              (_altflags_local + i,first_i._4_4_ - i,local_20,rune._4_4_ + -1);
            x_1[0] = AlternateNoFactor(_altflags_local + i,iVar2,local_20);
            pRVar5 = Concat((Regexp **)&nn_1,2,local_20);
            _altflags_local[local_40] = pRVar5;
          }
          local_40 = local_40 + 1;
        }
        if (first_i._4_4_ < maxdepth_local) {
          i = first_i._4_4_;
          pRStack_88 = x_1[1];
        }
      }
LAB_0012f4e6:
    }
    maxdepth_local = local_40;
    i = 0;
    local_40 = 0;
    for (ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <= maxdepth_local;
        ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      if ((maxdepth_local <= ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) ||
         ((RVar3 = op(_altflags_local
                      [ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_]),
          RVar3 != kRegexpLiteral &&
          (RVar3 = op(_altflags_local
                      [ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_]),
          RVar3 != kRegexpCharClass)))) {
        if (ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != i) {
          if (ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == i + 1) {
            _altflags_local[local_40] = _altflags_local[i];
            local_40 = local_40 + 1;
          }
          else {
            CharClassBuilder::CharClassBuilder((CharClassBuilder *)local_f8);
            for (re._4_4_ = i;
                re._4_4_ < ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
                re._4_4_ = re._4_4_ + 1) {
              local_108 = _altflags_local[re._4_4_];
              RVar3 = op(local_108);
              if (RVar3 == kRegexpCharClass) {
                it = (iterator)Regexp::cc(local_108);
                for (local_128 = CharClass::begin((CharClass *)it); pRVar1 = local_128,
                    pRVar7 = CharClass::end((CharClass *)it), pRVar1 != pRVar7;
                    local_128 = local_128 + 1) {
                  CharClassBuilder::AddRange
                            ((CharClassBuilder *)local_f8,local_128->lo,local_128->hi);
                }
              }
              else {
                RVar3 = op(local_108);
                if (RVar3 == kRegexpLiteral) {
                  lo = Regexp::rune(local_108);
                  hi = Regexp::rune(local_108);
                  parse_flags = Regexp::parse_flags(local_108);
                  CharClassBuilder::AddRangeFlags((CharClassBuilder *)local_f8,lo,hi,parse_flags);
                }
                else {
                  LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_2a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc"
                             ,0x409);
                  poVar8 = LogMessage::stream(&local_2a8);
                  poVar8 = std::operator<<(poVar8,"RE2: unexpected op: ");
                  RVar3 = op(local_108);
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,RVar3);
                  poVar8 = std::operator<<(poVar8," ");
                  ToString_abi_cxx11_((Regexp *)local_2c8);
                  std::operator<<(poVar8,(string *)local_2c8);
                  std::__cxx11::string::~string((string *)local_2c8);
                  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a8);
                }
              }
              Decref(local_108);
            }
            cc_00 = CharClassBuilder::GetCharClass((CharClassBuilder *)local_f8);
            pRVar5 = NewCharClass(cc_00,local_20);
            _altflags_local[local_40] = pRVar5;
            local_40 = local_40 + 1;
            CharClassBuilder::~CharClassBuilder((CharClassBuilder *)local_f8);
          }
        }
        if (ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < maxdepth_local) {
          _altflags_local[local_40] =
               _altflags_local[ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_];
          local_40 = local_40 + 1;
        }
        i = ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
      }
    }
    maxdepth_local = local_40;
    i = 0;
    local_40 = 0;
    for (local_2cc = 0; local_2cc < maxdepth_local; local_2cc = local_2cc + 1) {
      if (((local_2cc + 1 < maxdepth_local) &&
          (RVar3 = op(_altflags_local[local_2cc]), RVar3 == kRegexpEmptyMatch)) &&
         (RVar3 = op(_altflags_local[local_2cc + 1]), RVar3 == kRegexpEmptyMatch)) {
        Decref(_altflags_local[local_2cc]);
      }
      else {
        _altflags_local[local_40] = _altflags_local[local_2cc];
        local_40 = local_40 + 1;
      }
    }
    sub_local._4_4_ = local_40;
  }
  return sub_local._4_4_;
}

Assistant:

int Regexp::FactorAlternationRecursive(
    Regexp** sub, int n,
    Regexp::ParseFlags altflags,
    int maxdepth) {

  if (maxdepth <= 0)
    return n;

  // Round 1: Factor out common literal prefixes.
  Rune *rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  int start = 0;
  int out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin
    // with the string rune[0:nrune].

    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < n) {
      rune_i = LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune] but sub[i]
    // does not even begin with rune[0].
    //
    // Factor out common string and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        RemoveLeadingString(sub[j], nrune);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                          maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
  n = out;

  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  start = 0;
  out = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin with first.

    Regexp* first_i = NULL;
    if (i < n) {
      first_i = LeadingRegexp(sub[i]);
      if (first != NULL && Regexp::Equal(first, first_i) &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte)))) {
        continue;
      }
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first but sub[i] does not.
    //
    // Factor out common regexp and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = RemoveLeadingRegexp(sub[j]);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                   maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      first = first_i;
    }
  }
  n = out;

  // Round 3: Collapse runs of single literals into character classes.
  start = 0;
  out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that are either
    // literal runes or character classes.

    if (i < n &&
        (sub[i]->op() == kRegexpLiteral ||
         sub[i]->op() == kRegexpCharClass))
      continue;

    // sub[i] is not a char or char class;
    // emit char class for sub[start:i]...
    if (i == start) {
      // Nothing to do.
    } else if (i == start+1) {
      sub[out++] = sub[start];
    } else {
      // Make new char class.
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      sub[out++] = NewCharClass(ccb.GetCharClass(), altflags);
    }

    // ... and then emit sub[i].
    if (i < n)
      sub[out++] = sub[i];
    start = i+1;
  }
  n = out;

  // Round 4: Collapse runs of empty matches into single empty match.
  start = 0;
  out = 0;
  for (int i = 0; i < n; i++) {
    if (i + 1 < n &&
        sub[i]->op() == kRegexpEmptyMatch &&
        sub[i+1]->op() == kRegexpEmptyMatch) {
      sub[i]->Decref();
      continue;
    }
    sub[out++] = sub[i];
  }
  n = out;

  return n;
}